

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgStatement.cpp
# Opt level: O0

void __thiscall
rsg::ConditionalStatement::tokenize
          (ConditionalStatement *this,GeneratorState *state,TokenStream *str)

{
  bool bVar1;
  TokenStream *pTVar2;
  Token local_e0;
  Token local_d0;
  Token local_c0;
  Token local_b0;
  Token local_a0;
  Token local_90;
  Token local_80;
  Token local_70;
  Token local_60;
  Token local_50 [2];
  Token local_30;
  TokenStream *local_20;
  TokenStream *str_local;
  GeneratorState *state_local;
  ConditionalStatement *this_local;
  
  local_20 = str;
  str_local = (TokenStream *)state;
  state_local = (GeneratorState *)this;
  Token::Token(&local_30,IF);
  pTVar2 = TokenStream::operator<<(str,&local_30);
  Token::Token(local_50,LEFT_PAREN);
  TokenStream::operator<<(pTVar2,local_50);
  Token::~Token(local_50);
  Token::~Token(&local_30);
  (*this->m_condition->_vptr_Expression[3])(this->m_condition,str_local,local_20);
  pTVar2 = local_20;
  Token::Token(&local_60,RIGHT_PAREN);
  pTVar2 = TokenStream::operator<<(pTVar2,&local_60);
  Token::Token(&local_70,NEWLINE);
  TokenStream::operator<<(pTVar2,&local_70);
  Token::~Token(&local_70);
  Token::~Token(&local_60);
  bVar1 = anon_unknown_0::isBlockStatement(this->m_trueStatement);
  pTVar2 = local_20;
  if (bVar1) {
    (*this->m_trueStatement->_vptr_Statement[3])(this->m_trueStatement,str_local,local_20);
  }
  else {
    Token::Token(&local_80,INDENT_INC);
    TokenStream::operator<<(pTVar2,&local_80);
    Token::~Token(&local_80);
    (*this->m_trueStatement->_vptr_Statement[3])(this->m_trueStatement,str_local,local_20);
    pTVar2 = local_20;
    Token::Token(&local_90,INDENT_DEC);
    TokenStream::operator<<(pTVar2,&local_90);
    Token::~Token(&local_90);
  }
  pTVar2 = local_20;
  if (this->m_falseStatement != (Statement *)0x0) {
    Token::Token(&local_a0,ELSE);
    TokenStream::operator<<(pTVar2,&local_a0);
    Token::~Token(&local_a0);
    bVar1 = anon_unknown_0::isConditionalStatement(this->m_falseStatement);
    if (bVar1) {
      (*this->m_falseStatement->_vptr_Statement[3])(this->m_falseStatement,str_local,local_20);
    }
    else {
      bVar1 = anon_unknown_0::isBlockStatement(this->m_falseStatement);
      pTVar2 = local_20;
      if (bVar1) {
        Token::Token(&local_b0,NEWLINE);
        TokenStream::operator<<(pTVar2,&local_b0);
        Token::~Token(&local_b0);
        (*this->m_falseStatement->_vptr_Statement[3])(this->m_falseStatement,str_local,local_20);
      }
      else {
        Token::Token(&local_c0,NEWLINE);
        pTVar2 = TokenStream::operator<<(pTVar2,&local_c0);
        Token::Token(&local_d0,INDENT_INC);
        TokenStream::operator<<(pTVar2,&local_d0);
        Token::~Token(&local_d0);
        Token::~Token(&local_c0);
        (*this->m_falseStatement->_vptr_Statement[3])(this->m_falseStatement,str_local,local_20);
        pTVar2 = local_20;
        Token::Token(&local_e0,INDENT_DEC);
        TokenStream::operator<<(pTVar2,&local_e0);
        Token::~Token(&local_e0);
      }
    }
  }
  return;
}

Assistant:

void ConditionalStatement::tokenize (GeneratorState& state, TokenStream& str) const
{
	DE_ASSERT(m_condition && m_trueStatement);

	// if (condition)
	str << Token::IF << Token::LEFT_PAREN;
	m_condition->tokenize(state, str);
	str << Token::RIGHT_PAREN << Token::NEWLINE;

	// Statement executed if true
	if (!isBlockStatement(m_trueStatement))
	{
		str << Token::INDENT_INC;
		m_trueStatement->tokenize(state, str);
		str << Token::INDENT_DEC;
	}
	else
		m_trueStatement->tokenize(state, str);

	if (m_falseStatement)
	{
		str << Token::ELSE;

		if (isConditionalStatement(m_falseStatement))
		{
			m_falseStatement->tokenize(state, str);
		}
		else if (isBlockStatement(m_falseStatement))
		{
			str << Token::NEWLINE;
			m_falseStatement->tokenize(state, str);
		}
		else
		{
			str << Token::NEWLINE << Token::INDENT_INC;
			m_falseStatement->tokenize(state, str);
			str << Token::INDENT_DEC;
		}
	}
}